

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_address.cpp
# Opt level: O2

void __thiscall
cfd::core::Address::Address
          (Address *this,NetType_conflict type,AddressType addr_type,ByteData160 *hash)

{
  CfdException *this_00;
  allocator local_71;
  SchnorrPubkey *local_70;
  Pubkey *local_68;
  ByteData *local_60;
  string *local_58;
  string local_50;
  
  this->type_ = type;
  this->addr_type_ = addr_type;
  this->witness_ver_ = kVersionNone;
  ::std::__cxx11::string::string((string *)&this->address_,"",(allocator *)&local_50);
  local_58 = &this->address_;
  ByteData160::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_50,hash);
  ByteData::ByteData(&this->hash_,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_50
                    );
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_50);
  local_60 = &this->hash_;
  Pubkey::Pubkey(&this->pubkey_);
  local_70 = &this->schnorr_pubkey_;
  local_68 = &this->pubkey_;
  SchnorrPubkey::SchnorrPubkey(local_70);
  TaprootScriptTree::TaprootScriptTree(&this->script_tree_);
  Script::Script(&this->redeem_script_);
  AddressFormatData::AddressFormatData(&this->format_data_);
  this->checksum_[0] = '\0';
  this->checksum_[1] = '\0';
  this->checksum_[2] = '\0';
  this->checksum_[3] = '\0';
  if ((addr_type - kP2shP2wshAddress < 2) || (addr_type == kP2shAddress)) {
    CalculateP2SH(this,hash,'\0');
  }
  else {
    if (addr_type != kP2pkhAddress) {
      this_00 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string
                ((string *)&local_50,"Support addressType is p2pkh or p2sh",&local_71);
      CfdException::CfdException(this_00,kCfdIllegalArgumentError,&local_50);
      __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
    }
    CalculateP2PKH(this,hash,'\0');
  }
  return;
}

Assistant:

Address::Address(NetType type, AddressType addr_type, const ByteData160& hash)
    : type_(type),
      addr_type_(addr_type),
      witness_ver_(kVersionNone),
      address_(""),
      hash_(hash.GetBytes()),
      pubkey_(),
      schnorr_pubkey_(),
      redeem_script_() {
  memset(checksum_, 0, sizeof(checksum_));
  if (addr_type == kP2pkhAddress) {
    CalculateP2PKH(hash);
  } else if (
      (addr_type == kP2shAddress) || (addr_type == kP2shP2wshAddress) ||
      (addr_type == kP2shP2wpkhAddress)) {
    CalculateP2SH(hash);
  } else {
    throw CfdException(
        kCfdIllegalArgumentError, "Support addressType is p2pkh or p2sh");
  }
}